

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
          (ConfidentialTxOutReference *this,ConfidentialTxOut *tx_out)

{
  AbstractTxOutReference::AbstractTxOutReference
            (&this->super_AbstractTxOutReference,&tx_out->super_AbstractTxOut);
  (this->super_AbstractTxOutReference)._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialTxOutReference_00277150;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,&tx_out->asset_);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,&tx_out->confidential_value_);
  ConfidentialNonce::ConfidentialNonce(&this->nonce_,&tx_out->nonce_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->surjection_proof_,
             &(tx_out->surjection_proof_).data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->range_proof_,
             &(tx_out->range_proof_).data_);
  return;
}

Assistant:

ConfidentialTxOutReference::ConfidentialTxOutReference(
    const ConfidentialTxOut &tx_out)
    : AbstractTxOutReference(tx_out),
      asset_(tx_out.GetAsset()),
      confidential_value_(tx_out.GetConfidentialValue()),
      nonce_(tx_out.GetNonce()),
      surjection_proof_(tx_out.GetSurjectionProof()),
      range_proof_(tx_out.GetRangeProof()) {
  // do nothing
}